

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O2

void ev3dev::sound::beep(string *args,bool bSynchronous)

{
  ostream *poVar1;
  ostringstream cmd;
  char *local_1b0 [4];
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"/usr/bin/beep ");
  std::operator<<(poVar1,(string *)args);
  if (!bSynchronous) {
    std::operator<<((ostream *)local_190," &");
  }
  std::__cxx11::stringbuf::str();
  system(local_1b0[0]);
  std::__cxx11::string::~string((string *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void sound::beep(const std::string &args, bool bSynchronous) {
    std::ostringstream cmd;
    cmd << "/usr/bin/beep " << args;
    if (!bSynchronous) cmd << " &";
    std::system(cmd.str().c_str());
}